

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VScaleAddMultiVectorArray(N_Vector V,sunindextype local_length,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint in_EDX;
  N_Vector in_RDI;
  double dVar9;
  double dVar10;
  N_Vector *Z [3];
  N_Vector *Y [3];
  N_Vector *X;
  sunrealtype a [3];
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  sunindextype sVar11;
  N_Vector in_stack_ffffffffffffffb0;
  N_Vector p_Var12;
  sunrealtype in_stack_ffffffffffffffb8;
  sunrealtype sVar13;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  local_60 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_78 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_70 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_68 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_98 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_90 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_88 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  sVar11 = 0x4000000000000000;
  N_VConst(0x3ff0000000000000,*local_60);
  N_VConst(0xbff0000000000000,*local_78);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(1,1,&stack0xffffffffffffffa8,local_60,&local_78,&local_78);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,sVar11);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1a, Proc %d \n",(ulong)in_EDX);
    local_18 = 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  sVar11 = 0x4000000000000000;
  N_VConst(0x3ff0000000000000,*local_60);
  N_VConst(0xbff0000000000000,*local_78);
  N_VConst(0,*local_98);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(1,1,&stack0xffffffffffffffa8,local_60,&local_78,&local_98);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,sVar11);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  sVar11 = 0x3ff0000000000000;
  p_Var12 = (N_Vector)&DAT_c000000000000000;
  sVar13 = 2.0;
  N_VConst(0x3ff0000000000000,*local_60);
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0x4000000000000000,*local_70);
  N_VConst(0xbff0000000000000,*local_68);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(1,3,&stack0xffffffffffffffa8,local_60,&local_78,&local_78);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar13,p_Var12,sVar11);
    iVar2 = check_ans(sVar13,p_Var12,sVar11);
    local_1c = check_ans(sVar13,p_Var12,sVar11);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  sVar11 = 0x3ff0000000000000;
  p_Var12 = (N_Vector)&DAT_c000000000000000;
  sVar13 = 2.0;
  N_VConst(0x3ff0000000000000,*local_60);
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0x4000000000000000,*local_70);
  N_VConst(0xbff0000000000000,*local_68);
  N_VConst(0,*local_98);
  N_VConst(0x3ff0000000000000,*local_90);
  N_VConst(0x4000000000000000,*local_88);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(1,3,&stack0xffffffffffffffa8,local_60,&local_78,&local_98);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar13,p_Var12,sVar11);
    iVar2 = check_ans(sVar13,p_Var12,sVar11);
    local_1c = check_ans(sVar13,p_Var12,sVar11);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  sVar11 = 0x4000000000000000;
  N_VConst(0x3fe0000000000000,*local_60);
  N_VConst(0xbff0000000000000,local_60[1]);
  N_VConst(0x3ff0000000000000,local_60[2]);
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0x4000000000000000,local_78[1]);
  N_VConst(0xbff0000000000000,local_78[2]);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(3,1,&stack0xffffffffffffffa8,local_60,&local_78,&local_78);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar13,p_Var12,sVar11);
    iVar2 = check_ans(sVar13,p_Var12,sVar11);
    local_1c = check_ans(sVar13,p_Var12,sVar11);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  sVar11 = 0x4000000000000000;
  N_VConst(0x3fe0000000000000,*local_60);
  N_VConst(0xbff0000000000000,local_60[1]);
  N_VConst(0x3ff0000000000000,local_60[2]);
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0x4000000000000000,local_78[1]);
  N_VConst(0xbff0000000000000,local_78[2]);
  N_VConst(0x4000000000000000,*local_98);
  N_VConst(0x4000000000000000,local_98[1]);
  N_VConst(0x4000000000000000,local_98[2]);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(3,1,&stack0xffffffffffffffa8,local_60,&local_78,&local_98);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar13,p_Var12,sVar11);
    iVar2 = check_ans(sVar13,p_Var12,sVar11);
    local_1c = check_ans(sVar13,p_Var12,sVar11);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  sVar11 = 0x4000000000000000;
  p_Var12 = (N_Vector)&DAT_3ff0000000000000;
  sVar13 = -2.0;
  N_VConst(0x3fe0000000000000,*local_60);
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0xbfe0000000000000,*local_70);
  N_VConst(0x4000000000000000,*local_68);
  N_VConst(0x3ff0000000000000,local_60[1]);
  N_VConst(0xbff0000000000000,local_78[1]);
  N_VConst(0xc000000000000000,local_70[1]);
  N_VConst(0x4000000000000000,local_68[1]);
  N_VConst(0xc000000000000000,local_60[2]);
  N_VConst(0x4000000000000000,local_78[2]);
  N_VConst(0x4010000000000000,local_70[2]);
  N_VConst(0xc010000000000000,local_68[2]);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(3,3,&stack0xffffffffffffffa8,local_60,&local_78,&local_78);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar13,p_Var12,sVar11);
    iVar2 = check_ans(sVar13,p_Var12,sVar11);
    iVar3 = check_ans(sVar13,p_Var12,sVar11);
    iVar4 = check_ans(sVar13,p_Var12,sVar11);
    iVar5 = check_ans(sVar13,p_Var12,sVar11);
    iVar6 = check_ans(sVar13,p_Var12,sVar11);
    iVar7 = check_ans(sVar13,p_Var12,sVar11);
    iVar8 = check_ans(sVar13,p_Var12,sVar11);
    local_1c = check_ans(sVar13,p_Var12,sVar11);
    local_1c = local_1c + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  sVar11 = 0x4000000000000000;
  p_Var12 = (N_Vector)&DAT_3ff0000000000000;
  sVar13 = -2.0;
  N_VConst(0x3fe0000000000000,*local_60);
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0xbfe0000000000000,*local_70);
  N_VConst(0x4000000000000000,*local_68);
  N_VConst(0x3fe0000000000000,*local_98);
  N_VConst(0x3fe0000000000000,*local_90);
  N_VConst(0x3fe0000000000000,*local_88);
  N_VConst(0x3ff0000000000000,local_60[1]);
  N_VConst(0xbff0000000000000,local_78[1]);
  N_VConst(0xc000000000000000,local_70[1]);
  N_VConst(0x4000000000000000,local_68[1]);
  N_VConst(0x3fe0000000000000,local_98[1]);
  N_VConst(0x3fe0000000000000,local_90[1]);
  N_VConst(0x3fe0000000000000,local_88[1]);
  N_VConst(0xc000000000000000,local_60[2]);
  N_VConst(0x4000000000000000,local_78[2]);
  N_VConst(0x4010000000000000,local_70[2]);
  N_VConst(0xc010000000000000,local_68[2]);
  N_VConst(0x3fe0000000000000,local_98[2]);
  N_VConst(0x3fe0000000000000,local_90[2]);
  N_VConst(0x3fe0000000000000,local_88[2]);
  dVar9 = get_time();
  iVar1 = N_VScaleAddMultiVectorArray(3,3,&stack0xffffffffffffffa8,local_60,&local_78,&local_98);
  sync_device(in_RDI);
  dVar10 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar13,p_Var12,sVar11);
    iVar2 = check_ans(sVar13,p_Var12,sVar11);
    iVar3 = check_ans(sVar13,p_Var12,sVar11);
    iVar4 = check_ans(sVar13,p_Var12,sVar11);
    iVar5 = check_ans(sVar13,p_Var12,sVar11);
    iVar6 = check_ans(sVar13,p_Var12,sVar11);
    iVar7 = check_ans(sVar13,p_Var12,sVar11);
    iVar8 = check_ans(sVar13,p_Var12,sVar11);
    local_1c = check_ans(sVar13,p_Var12,sVar11);
    local_1c = local_1c + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar9 = max_time(in_RDI,dVar10 - dVar9);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar9,"N_VScaleAddMultiVectorArray");
  }
  N_VDestroyVectorArray(local_60,3);
  N_VDestroyVectorArray(local_78,3);
  N_VDestroyVectorArray(local_70,3);
  N_VDestroyVectorArray(local_68,3);
  N_VDestroyVectorArray(local_98,3);
  N_VDestroyVectorArray(local_90,3);
  N_VDestroyVectorArray(local_88,3);
  return local_18;
}

Assistant:

int Test_N_VScaleAddMultiVectorArray(N_Vector V, sunindextype local_length,
                                     int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype a[3];
  N_Vector* X;
  N_Vector* Y[3];
  N_Vector* Z[3];

  /* create vectors for testing */
  X = N_VCloneVectorArray(3, V);

  Y[0] = N_VCloneVectorArray(3, V);
  Y[1] = N_VCloneVectorArray(3, V);
  Y[2] = N_VCloneVectorArray(3, V);

  Z[0] = N_VCloneVectorArray(3, V);
  Z[1] = N_VCloneVectorArray(3, V);
  Z[2] = N_VCloneVectorArray(3, V);

  /*
   * Case 1a (nvec = 1, nsum = 1):
   * Z[0][0] = a[0] X[0] + Y[0][0], N_VLinearSum
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(ONE, X[0]);
  N_VConst(NEG_ONE, Y[0][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 1, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  /* Y[0][0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 1b (nvec = 1, nsum = 1):
   * Z[0][0] = a[0] X[0] + Y[0][0], N_VLinearSum
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(ONE, X[0]);
  N_VConst(NEG_ONE, Y[0][0]);
  N_VConst(ZERO, Z[0][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 1, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[0][0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 2a (nvec = 1, nsum > 1):
   * Y[j][0] = a[j] X[0] + Y[j][0], N_VScaleAddMulti
   */

  /* fill scaling and vector data */
  a[0] = ONE;
  a[1] = NEG_TWO;
  a[2] = TWO;

  N_VConst(ONE, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[1][0]);
  N_VConst(NEG_ONE, Y[2][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 3, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  /* Y[i][0] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO, Y[1][0], local_length);
    failure += check_ans(ONE, Y[2][0], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 2b (nvec = 1, nsum > 1):
   * Z[j][0] = a[j] X[0] + Y[j][0], N_VScaleAddMulti
   */

  /* fill scaling and vector data */
  a[0] = ONE;
  a[1] = NEG_TWO;
  a[2] = TWO;

  N_VConst(ONE, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[1][0]);
  N_VConst(NEG_ONE, Y[2][0]);

  N_VConst(ZERO, Z[0][0]);
  N_VConst(ONE, Z[1][0]);
  N_VConst(TWO, Z[2][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 3, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[i][0] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO, Z[1][0], local_length);
    failure += check_ans(ONE, Z[2][0], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 3a (nvec > 1, nsum = 1):
   * Y[0][i] = a[0] X[i] + Y[0][i], N_VLinearSumVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(HALF, X[0]);
  N_VConst(NEG_ONE, X[1]);
  N_VConst(ONE, X[2]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[0][1]);
  N_VConst(NEG_ONE, Y[0][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 1, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  /* Y[0][i] should be vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO, Y[0][1], local_length);
    failure += check_ans(ONE, Y[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 3b (nvec > 1, nsum = 1):
   * Z[j][0] = a[j] X[0] + Y[j][0], N_VLinearSumVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(HALF, X[0]);
  N_VConst(NEG_ONE, X[1]);
  N_VConst(ONE, X[2]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[0][1]);
  N_VConst(NEG_ONE, Y[0][2]);

  N_VConst(TWO, Z[0][0]);
  N_VConst(TWO, Z[0][1]);
  N_VConst(TWO, Z[0][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 1, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[0][i] should be vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO, Z[0][1], local_length);
    failure += check_ans(ONE, Z[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 4a (nvec > 1, nsum > 1):
   * Y[j][i] = a[j] X[i] + Y[j][i], N_VScaleAddMultiVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;
  a[1] = ONE;
  a[2] = NEG_TWO;

  N_VConst(HALF, X[0]);
  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(NEG_HALF, Y[1][0]);
  N_VConst(TWO, Y[2][0]);

  N_VConst(ONE, X[1]);
  N_VConst(NEG_ONE, Y[0][1]);
  N_VConst(NEG_TWO, Y[1][1]);
  N_VConst(TWO, Y[2][1]);

  N_VConst(NEG_TWO, X[2]);
  N_VConst(TWO, Y[0][2]);
  N_VConst(TWO * TWO, Y[1][2]);
  N_VConst(NEG_TWO * TWO, Y[2][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 3, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  if (ierr == 0)
  {
    /* Y[i][0] should be vector of -1, 0, +1 */
    failure = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO, Y[1][0], local_length);
    failure += check_ans(ONE, Y[2][0], local_length);

    /* Y[i][1] should be vector of +1, -1, 0 */
    failure += check_ans(ONE, Y[0][1], local_length);
    failure += check_ans(NEG_ONE, Y[1][1], local_length);
    failure += check_ans(ZERO, Y[2][1], local_length);

    /* Y[i][2] should be vector of -2, 2, 0 */
    failure += check_ans(NEG_TWO, Y[0][2], local_length);
    failure += check_ans(TWO, Y[1][2], local_length);
    failure += check_ans(ZERO, Y[2][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 4b (nvec > 1, nsum > 1):
   * Z[j][i] = a[j] X[i] + Y[j][i], N_VScaleAddMultiVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;
  a[1] = ONE;
  a[2] = NEG_TWO;

  N_VConst(HALF, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(NEG_HALF, Y[1][0]);
  N_VConst(TWO, Y[2][0]);

  N_VConst(HALF, Z[0][0]);
  N_VConst(HALF, Z[1][0]);
  N_VConst(HALF, Z[2][0]);

  N_VConst(ONE, X[1]);

  N_VConst(NEG_ONE, Y[0][1]);
  N_VConst(NEG_TWO, Y[1][1]);
  N_VConst(TWO, Y[2][1]);

  N_VConst(HALF, Z[0][1]);
  N_VConst(HALF, Z[1][1]);
  N_VConst(HALF, Z[2][1]);

  N_VConst(NEG_TWO, X[2]);

  N_VConst(TWO, Y[0][2]);
  N_VConst(TWO * TWO, Y[1][2]);
  N_VConst(NEG_TWO * TWO, Y[2][2]);

  N_VConst(HALF, Z[0][2]);
  N_VConst(HALF, Z[1][2]);
  N_VConst(HALF, Z[2][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 3, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  if (ierr == 0)
  {
    /* Z[i][0] should be vector of -1, 0, +1 */
    failure = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO, Z[1][0], local_length);
    failure += check_ans(ONE, Z[2][0], local_length);

    /* Z[i][1] should be vector of +1, -1, 0 */
    failure += check_ans(ONE, Z[0][1], local_length);
    failure += check_ans(NEG_ONE, Z[1][1], local_length);
    failure += check_ans(ZERO, Z[2][1], local_length);

    /* Z[i][2] should be vector of -2, 2, 0 */
    failure += check_ans(NEG_TWO, Z[0][2], local_length);
    failure += check_ans(TWO, Z[1][2], local_length);
    failure += check_ans(ZERO, Z[2][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(X, 3);
  N_VDestroyVectorArray(Y[0], 3);
  N_VDestroyVectorArray(Y[1], 3);
  N_VDestroyVectorArray(Y[2], 3);
  N_VDestroyVectorArray(Z[0], 3);
  N_VDestroyVectorArray(Z[1], 3);
  N_VDestroyVectorArray(Z[2], 3);

  return (fails);
}